

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_ManDumpTestsDelay(Vec_Int_t *vTests,int nIter,char *pFileName,Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  int iVar6;
  
  __stream = fopen(pFileName,"wb");
  p_00 = Vec_IntAlloc(p->vCis->nSize);
  iVar1 = vTests->nSize / nIter;
  if (vTests->nSize % nIter != 0) {
    __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x353,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  if (iVar1 == p->nRegs + (p->vCis->nSize - p->nRegs) * 2) {
    if (nIter < 1) {
      nIter = 0;
    }
    iVar5 = 0;
    for (iVar4 = 0; iVar4 != nIter; iVar4 = iVar4 + 1) {
      p_00->nSize = 0;
      for (iVar6 = p->nRegs; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
        uVar2 = Vec_IntEntry(vTests,iVar5 + iVar6);
        fprintf(__stream,"%d",(ulong)uVar2);
        iVar3 = Vec_IntEntry(vTests,iVar5 + iVar6);
        Vec_IntPush(p_00,iVar3);
      }
      for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
        uVar2 = Vec_IntEntry(vTests,iVar5 + iVar6);
        fprintf(__stream,"%d",(ulong)uVar2);
        iVar3 = Vec_IntEntry(vTests,iVar5 + iVar6);
        Vec_IntPush(p_00,iVar3);
      }
      fputc(10,__stream);
      Gia_ManDumpTestsSimulate(p,p_00);
      for (iVar6 = p->vCis->nSize; iVar6 < iVar1; iVar6 = iVar6 + 1) {
        uVar2 = Vec_IntEntry(vTests,iVar5 + iVar6);
        fprintf(__stream,"%d",(ulong)uVar2);
      }
      iVar6 = p_00->nSize;
      iVar3 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      for (; iVar6 != iVar3; iVar3 = iVar3 + 1) {
        uVar2 = Vec_IntEntry(p_00,iVar3);
        fprintf(__stream,"%d",(ulong)uVar2);
      }
      fputc(10,__stream);
      iVar5 = iVar5 + iVar1;
    }
    Gia_ManCleanMark0(p);
    fclose(__stream);
    Vec_IntFree(p_00);
    return;
  }
  __assert_fail("nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x354,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
}

Assistant:

void Gia_ManDumpTestsDelay( Vec_Int_t * vTests, int nIter, char * pFileName, Gia_Man_t * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vValues = Vec_IntAlloc( Gia_ManCiNum(p) );
    int i, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    assert( nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p) );
    for ( i = 0; i < nIter; i++ )
    {
        // collect PIs followed by flops
        Vec_IntClear( vValues );
        for ( v = Gia_ManRegNum(p); v < Gia_ManCiNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        for ( v = 0; v < Gia_ManRegNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        fprintf( pFile, "\n" );
        // derive next-state values
        Gia_ManDumpTestsSimulate( p, vValues );
        // collect PIs followed by flops
        for ( v = Gia_ManCiNum(p); v < nVars; v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
        for ( v = 0; v < Vec_IntSize(vValues); v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vValues, v) );
        fprintf( pFile, "\n" );
    }
    Gia_ManCleanMark0(p);
    fclose( pFile );
    Vec_IntFree( vValues );
}